

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implicit_weak_message.h
# Opt level: O2

uint8 * __thiscall
google::protobuf::internal::ImplicitWeakMessage::_InternalSerialize
          (ImplicitWeakMessage *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint8 *puVar1;
  
  puVar1 = io::EpsCopyOutputStream::WriteRaw
                     (stream,(this->data_)._M_dataplus._M_p,(int)(this->data_)._M_string_length,
                      target);
  return puVar1;
}

Assistant:

uint8* _InternalSerialize(uint8* target,
                            io::EpsCopyOutputStream* stream) const final {
    return stream->WriteRaw(data_.data(), static_cast<int>(data_.size()),
                            target);
  }